

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O2

void printsub(Curl_easy *data,int direction,uchar *pointer,size_t length)

{
  byte bVar1;
  byte bVar2;
  uchar uVar3;
  uint uVar4;
  curl_trc_feat *pcVar5;
  char *pcVar6;
  char *fmt;
  ulong uVar7;
  ulong uVar8;
  
  if (((data->set).field_0x89f & 0x40) == 0) {
    return;
  }
  pcVar5 = (data->state).feat;
  if ((pcVar5 == (curl_trc_feat *)0x0) || (0 < pcVar5->log_level)) {
    pcVar6 = "SENT";
    if (direction == 0x3c) {
      pcVar6 = "RCVD";
    }
    Curl_infof(data,"%s IAC SB ",pcVar6);
  }
  if (length < 3) {
    if (length != 2) {
      return;
    }
    if (((data->set).field_0x89f & 0x40) == 0) {
      return;
    }
    pcVar5 = (data->state).feat;
    if ((pcVar5 != (curl_trc_feat *)0x0) && (pcVar5->log_level < 1)) {
      return;
    }
    Curl_infof(data,"(Empty suboption?)");
    return;
  }
  bVar1 = pointer[length - 2];
  bVar2 = pointer[length - 1];
  if (bVar2 != 0xf0 || bVar1 != 0xff) {
    if ((((data->set).field_0x89f & 0x40) != 0) &&
       ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level)))) {
      Curl_infof(data,"(terminated by ");
    }
    if (bVar1 < 0x28) {
      if ((((data->set).field_0x89f & 0x40) != 0) &&
         ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))))
      {
        pcVar6 = telnetoptions[bVar1];
LAB_001580c8:
        Curl_infof(data,"%s ",pcVar6);
      }
    }
    else {
      uVar4 = (uint)*(undefined8 *)&(data->set).field_0x89c;
      if (bVar1 < 0xec) {
        if (((uVar4 >> 0x1e & 1) != 0) &&
           ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))
           )) {
          Curl_infof(data,"%u ",(ulong)bVar1);
        }
      }
      else if (((uVar4 >> 0x1e & 1) != 0) &&
              ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
               (0 < pcVar5->log_level)))) {
        pcVar6 = telnetcmds[bVar1 - 0xec];
        goto LAB_001580c8;
      }
    }
    if (bVar2 < 0x28) {
      if ((((data->set).field_0x89f & 0x40) != 0) &&
         ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))))
      {
        pcVar6 = telnetoptions[bVar2];
LAB_00158179:
        Curl_infof(data,"%s",pcVar6);
      }
    }
    else {
      uVar4 = (uint)*(undefined8 *)&(data->set).field_0x89c;
      if (bVar2 < 0xec) {
        if (((uVar4 >> 0x1e & 1) != 0) &&
           ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))
           )) {
          Curl_infof(data,"%d");
        }
      }
      else if (((uVar4 >> 0x1e & 1) != 0) &&
              ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
               (0 < pcVar5->log_level)))) {
        pcVar6 = telnetcmds[bVar2 - 0xec];
        goto LAB_00158179;
      }
    }
    if ((((data->set).field_0x89f & 0x40) != 0) &&
       ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level)))) {
      Curl_infof(data,", not IAC SE) ");
    }
  }
  uVar8 = (ulong)*pointer;
  if (uVar8 < 0x28) {
    if ((*pointer < 0x28) && ((0x8881000000U >> (uVar8 & 0x3f) & 1) != 0)) {
      if ((((data->set).field_0x89f & 0x40) != 0) &&
         ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))))
      {
        pcVar6 = telnetoptions[uVar8];
        fmt = "%s";
LAB_0015822c:
        Curl_infof(data,fmt,pcVar6);
      }
    }
    else if ((((data->set).field_0x89f & 0x40) != 0) &&
            ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level)
             ))) {
      pcVar6 = telnetoptions[uVar8];
      fmt = "%s (unsupported)";
      goto LAB_0015822c;
    }
  }
  else if ((((data->set).field_0x89f & 0x40) != 0) &&
          ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level)))
          ) {
    Curl_infof(data,"%d (unknown)",(ulong)pointer[bVar1]);
  }
  uVar8 = length - 2;
  uVar3 = *pointer;
  if (uVar3 == '\x1f') {
    if (uVar8 < 5) {
      return;
    }
    if (((data->set).field_0x89f & 0x40) == 0) {
      return;
    }
    pcVar5 = (data->state).feat;
    if ((pcVar5 != (curl_trc_feat *)0x0) && (pcVar5->log_level < 1)) {
      return;
    }
    Curl_infof(data,"Width: %d ; Height: %d",
               (ulong)(ushort)(*(ushort *)(pointer + 1) << 8 | *(ushort *)(pointer + 1) >> 8),
               (ulong)(ushort)(*(ushort *)(pointer + 3) << 8 | *(ushort *)(pointer + 3) >> 8));
    return;
  }
  switch(pointer[1]) {
  case '\0':
    if (((data->set).field_0x89f & 0x40) != 0) {
      pcVar5 = (data->state).feat;
      pcVar6 = " IS";
LAB_0015836b:
      if ((pcVar5 == (curl_trc_feat *)0x0) || (0 < pcVar5->log_level)) {
        Curl_infof(data,pcVar6);
      }
    }
    break;
  case '\x01':
    if (((data->set).field_0x89f & 0x40) != 0) {
      pcVar5 = (data->state).feat;
      pcVar6 = " SEND";
      goto LAB_0015836b;
    }
    break;
  case '\x02':
    if (((data->set).field_0x89f & 0x40) != 0) {
      pcVar5 = (data->state).feat;
      pcVar6 = " INFO/REPLY";
      goto LAB_0015836b;
    }
    break;
  case '\x03':
    if (((data->set).field_0x89f & 0x40) != 0) {
      pcVar5 = (data->state).feat;
      pcVar6 = " NAME";
      goto LAB_0015836b;
    }
    break;
  default:
    goto switchD_00158307_default;
  }
  uVar3 = *pointer;
switchD_00158307_default:
  if ((uVar3 == '\x18') || (uVar3 == '#')) {
    pointer[uVar8] = '\0';
    if ((((data->set).field_0x89f & 0x40) != 0) &&
       ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level)))) {
      Curl_infof(data," \"%s\"",pointer + 2);
      return;
    }
  }
  else if (uVar3 == '\'') {
    if (pointer[1] == '\0') {
      if ((((data->set).field_0x89f & 0x40) != 0) &&
         ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))))
      {
        Curl_infof(data," ");
      }
      for (uVar7 = 3; uVar7 < uVar8; uVar7 = (ulong)((int)uVar7 + 1)) {
        uVar4 = (uint)*(undefined8 *)&(data->set).field_0x89c;
        if (pointer[uVar7] == '\x01') {
          if (((uVar4 >> 0x1e & 1) != 0) &&
             ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
              (0 < pcVar5->log_level)))) {
            pcVar6 = " = ";
LAB_0015844c:
            Curl_infof(data,pcVar6);
          }
        }
        else if (pointer[uVar7] == '\0') {
          if (((uVar4 >> 0x1e & 1) != 0) &&
             ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
              (0 < pcVar5->log_level)))) {
            pcVar6 = ", ";
            goto LAB_0015844c;
          }
        }
        else if (((uVar4 >> 0x1e & 1) != 0) &&
                ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
                 (0 < pcVar5->log_level)))) {
          Curl_infof(data,"%c");
        }
      }
    }
  }
  else {
    for (uVar7 = 2; uVar7 < uVar8; uVar7 = (ulong)((int)uVar7 + 1)) {
      if ((((data->set).field_0x89f & 0x40) != 0) &&
         ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))))
      {
        Curl_infof(data," %.2x",(ulong)pointer[uVar7]);
      }
    }
  }
  return;
}

Assistant:

static void printsub(struct Curl_easy *data,
                     int direction,             /* '<' or '>' */
                     unsigned char *pointer,    /* where suboption data is */
                     size_t length)             /* length of suboption data */
{
  if(data->set.verbose) {
    unsigned int i = 0;
    if(direction) {
      infof(data, "%s IAC SB ", (direction == '<') ? "RCVD" : "SENT");
      if(length >= 3) {
        int j;

        i = pointer[length-2];
        j = pointer[length-1];

        if(i != CURL_IAC || j != CURL_SE) {
          infof(data, "(terminated by ");
          if(CURL_TELOPT_OK(i))
            infof(data, "%s ", CURL_TELOPT(i));
          else if(CURL_TELCMD_OK(i))
            infof(data, "%s ", CURL_TELCMD(i));
          else
            infof(data, "%u ", i);
          if(CURL_TELOPT_OK(j))
            infof(data, "%s", CURL_TELOPT(j));
          else if(CURL_TELCMD_OK(j))
            infof(data, "%s", CURL_TELCMD(j));
          else
            infof(data, "%d", j);
          infof(data, ", not IAC SE) ");
        }
      }
      if(length >= 2)
        length -= 2;
      else /* bad input */
        return;
    }
    if(length < 1) {
      infof(data, "(Empty suboption?)");
      return;
    }

    if(CURL_TELOPT_OK(pointer[0])) {
      switch(pointer[0]) {
      case CURL_TELOPT_TTYPE:
      case CURL_TELOPT_XDISPLOC:
      case CURL_TELOPT_NEW_ENVIRON:
      case CURL_TELOPT_NAWS:
        infof(data, "%s", CURL_TELOPT(pointer[0]));
        break;
      default:
        infof(data, "%s (unsupported)", CURL_TELOPT(pointer[0]));
        break;
      }
    }
    else
      infof(data, "%d (unknown)", pointer[i]);

    switch(pointer[0]) {
    case CURL_TELOPT_NAWS:
      if(length > 4)
        infof(data, "Width: %d ; Height: %d", (pointer[1] << 8) | pointer[2],
              (pointer[3] << 8) | pointer[4]);
      break;
    default:
      switch(pointer[1]) {
      case CURL_TELQUAL_IS:
        infof(data, " IS");
        break;
      case CURL_TELQUAL_SEND:
        infof(data, " SEND");
        break;
      case CURL_TELQUAL_INFO:
        infof(data, " INFO/REPLY");
        break;
      case CURL_TELQUAL_NAME:
        infof(data, " NAME");
        break;
      }

      switch(pointer[0]) {
      case CURL_TELOPT_TTYPE:
      case CURL_TELOPT_XDISPLOC:
        pointer[length] = 0;
        infof(data, " \"%s\"", &pointer[2]);
        break;
      case CURL_TELOPT_NEW_ENVIRON:
        if(pointer[1] == CURL_TELQUAL_IS) {
          infof(data, " ");
          for(i = 3; i < length; i++) {
            switch(pointer[i]) {
            case CURL_NEW_ENV_VAR:
              infof(data, ", ");
              break;
            case CURL_NEW_ENV_VALUE:
              infof(data, " = ");
              break;
            default:
              infof(data, "%c", pointer[i]);
              break;
            }
          }
        }
        break;
      default:
        for(i = 2; i < length; i++)
          infof(data, " %.2x", pointer[i]);
        break;
      }
    }
  }
}